

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O3

void __thiscall QComboBoxPrivateScroller::~QComboBoxPrivateScroller(QComboBoxPrivateScroller *this)

{
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f06b8;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice =
       &PTR__QComboBoxPrivateScroller_007f0868;
  if ((this->timer).m_id != Invalid) {
    QBasicTimer::stop();
  }
  QWidget::~QWidget(&this->super_QWidget);
  operator_delete(this,0x38);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QComboBoxPrivateScroller : public QWidget
{
    Q_OBJECT

public:
    QComboBoxPrivateScroller(QAbstractSlider::SliderAction action, QWidget *parent)
        : QWidget(parent), sliderAction(action)
    {
        setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);
        setAttribute(Qt::WA_NoMousePropagation);
    }